

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::GatherBase::TextBody_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long *plVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  bool bVar8;
  string str_if;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  (**(code **)(*this + 0x100))(&local_170);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,0x1af48eb);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_180 = *plVar4;
    lStack_178 = plVar1[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *plVar4;
    local_190 = (long *)*plVar1;
  }
  local_188 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_190);
  local_110 = &local_100;
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_100 = *plVar4;
    lStack_f8 = plVar1[3];
  }
  else {
    local_100 = *plVar4;
    local_110 = (long *)*plVar1;
  }
  local_108 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  (**(code **)(*this + 0xb8))(&local_190,this);
  lVar2 = std::__cxx11::string::find((char)&local_190,0x75);
  bVar8 = true;
  if (lVar2 == -1) {
    (**(code **)(*this + 0xb8))(&local_170,this);
    lVar2 = std::__cxx11::string::find((char)&local_170,0x69);
    bVar8 = lVar2 != -1;
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (bVar8) {
    (**(code **)(*this + 0x100))(&local_150);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x1af4930);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_160 = *plVar4;
      lStack_158 = plVar1[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar4;
      local_170 = (long *)*plVar1;
    }
    local_168 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_170);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_180 = *plVar4;
      lStack_178 = plVar1[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar4;
      local_190 = (long *)*plVar1;
    }
    local_188 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_190);
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
  }
  (**(code **)(*this + 0xd0))(local_50);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1af4940);
  local_70 = &local_60;
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar1[3];
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar5 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar5) {
    local_e0 = *puVar5;
    uStack_d8 = (undefined4)plVar1[3];
    uStack_d4 = *(undefined4 *)((long)plVar1 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar5;
    local_f0 = (ulong *)*plVar1;
  }
  local_e8 = plVar1[1];
  *plVar1 = (long)puVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (**(code **)(*this + 0xb8))(&local_90,this);
  uVar7 = 0xf;
  if (local_f0 != &local_e0) {
    uVar7 = local_e0;
  }
  if (uVar7 < (ulong)(local_88 + local_e8)) {
    uVar7 = 0xf;
    if (local_90 != local_80) {
      uVar7 = local_80[0];
    }
    if (uVar7 < (ulong)(local_88 + local_e8)) goto LAB_00c00a53;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_00c00a53:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_90);
  }
  local_130 = &local_120;
  plVar1 = puVar3 + 2;
  if ((long *)*puVar3 == plVar1) {
    local_120 = *plVar1;
    uStack_118 = puVar3[3];
  }
  else {
    local_120 = *plVar1;
    local_130 = (long *)*puVar3;
  }
  local_128 = puVar3[1];
  *puVar3 = plVar1;
  puVar3[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar5 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar5) {
    local_c0 = *puVar5;
    uStack_b8 = (undefined4)plVar1[3];
    uStack_b4 = *(undefined4 *)((long)plVar1 + 0x1c);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar5;
    local_d0 = (ulong *)*plVar1;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)puVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (**(code **)(*this + 200))(&local_b0,this);
  uVar7 = 0xf;
  if (local_d0 != &local_c0) {
    uVar7 = local_c0;
  }
  if (uVar7 < (ulong)(local_a8 + local_c8)) {
    uVar7 = 0xf;
    if (local_b0 != local_a0) {
      uVar7 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_c8) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_00c00bab;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_00c00bab:
  local_150 = &local_140;
  plVar1 = puVar3 + 2;
  if ((long *)*puVar3 == plVar1) {
    local_140 = *plVar1;
    uStack_138 = puVar3[3];
  }
  else {
    local_140 = *plVar1;
    local_150 = (long *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = plVar1;
  puVar3[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_150);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_160 = *plVar4;
    lStack_158 = plVar1[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *plVar4;
    local_170 = (long *)*plVar1;
  }
  local_168 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_110);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_180 = *plVar4;
    lStack_178 = plVar1[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *plVar4;
    local_190 = (long *)*plVar1;
  }
  local_188 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_190);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar6) {
    lVar2 = plVar1[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar1[1];
  *plVar1 = (long)psVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TextBody()
	{
		std::string str_if = "    if (all(lessThanEqual(abs(tmp - " + Expected() + "), vec4(0.039)))) {           \n";
		if (Type().find('u') != std::string::npos || Type().find('i') != std::string::npos)
		{
			str_if = "    if (tmp == " + Expected() + ") {           \n";
		}
		return "vec4 test_function(vec4 p) {                                                                         "
			   "\n" +
			   Offset() + "    mediump " + Type() + " tmp = " + Gather() +
			   ";                                                   \n" + str_if +
			   "        return vec4(0.0, 1.0, 0.0, 1.0);                                                             \n"
			   "    } else {                                                                                         \n"
			   "        return vec4(float(tmp.x), float(tmp.y), float(tmp.z), float(tmp.w));                         \n"
			   "    }                                                                                                \n"
			   "}\n";
	}